

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O2

bool __thiscall pbrt::SquareMatrix<3>::IsIdentity(SquareMatrix<3> *this)

{
  float fVar1;
  int i;
  ulong uVar2;
  Float (*paFVar3) [3];
  int j;
  ulong uVar4;
  bool bVar5;
  
  paFVar3 = (Float (*) [3])this;
  for (uVar2 = 0; uVar2 != 3; uVar2 = uVar2 + 1) {
    for (uVar4 = 0; uVar4 != 3; uVar4 = uVar4 + 1) {
      if (uVar2 == uVar4) {
        fVar1 = *(float *)((long)this->m + uVar2 * 0x10);
        bVar5 = fVar1 == 1.0;
      }
      else {
        fVar1 = (*(Float (*) [3])*paFVar3)[uVar4];
        bVar5 = fVar1 == 0.0;
      }
      if ((!bVar5) || (NAN(fVar1))) goto LAB_0031185e;
    }
    paFVar3 = paFVar3 + 1;
  }
LAB_0031185e:
  return 2 < uVar2;
}

Assistant:

PBRT_CPU_GPU
    bool IsIdentity() const {
        for (int i = 0; i < N; ++i)
            for (int j = 0; j < N; ++j) {
                if (i == j) {
                    if (m[i][j] != 1)
                        return false;
                } else if (m[i][j] != 0)
                    return false;
            }
        return true;
    }